

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

int bitset_container_compute_cardinality(bitset_container_t *bitset)

{
  __m256i *data;
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  int i;
  ulong uVar4;
  uint64_t in_RSI;
  char cVar5;
  ushort uVar6;
  byte bVar16;
  char cVar17;
  byte bVar18;
  char cVar19;
  byte bVar20;
  char cVar21;
  byte bVar22;
  char cVar23;
  byte bVar24;
  undefined1 auVar14 [16];
  char cVar25;
  byte bVar39;
  char cVar40;
  byte bVar41;
  char cVar42;
  byte bVar43;
  char cVar44;
  byte bVar45;
  char cVar46;
  byte bVar47;
  undefined1 auVar30 [12];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined4 uVar7;
  undefined6 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar15 [16];
  ushort uVar26;
  undefined4 uVar27;
  undefined6 uVar28;
  undefined8 uVar29;
  undefined1 auVar31 [12];
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  undefined1 auVar35 [16];
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 2) == 0) {
    data = (__m256i *)bitset->words;
    if ((uVar1 & 1) == 0) {
      iVar2 = 0;
      for (uVar4 = 0; uVar4 < 0x400; uVar4 = uVar4 + 4) {
        auVar14 = *(undefined1 (*) [16])(*data + uVar4);
        auVar49 = *(undefined1 (*) [16])(*data + uVar4 + 2);
        auVar48._0_2_ = auVar49._0_2_ >> 1;
        auVar48._2_2_ = auVar49._2_2_ >> 1;
        auVar48._4_2_ = auVar49._4_2_ >> 1;
        auVar48._6_2_ = auVar49._6_2_ >> 1;
        auVar48._8_2_ = auVar49._8_2_ >> 1;
        auVar48._10_2_ = auVar49._10_2_ >> 1;
        auVar48._12_2_ = auVar49._12_2_ >> 1;
        auVar48._14_2_ = auVar49._14_2_ >> 1;
        auVar48 = auVar48 & _DAT_0010f540;
        uVar6 = CONCAT11(auVar49[1] - auVar48[1],auVar49[0] - auVar48[0]);
        uVar7 = CONCAT13(auVar49[3] - auVar48[3],CONCAT12(auVar49[2] - auVar48[2],uVar6));
        uVar8 = CONCAT15(auVar49[5] - auVar48[5],CONCAT14(auVar49[4] - auVar48[4],uVar7));
        uVar9 = CONCAT17(auVar49[7] - auVar48[7],CONCAT16(auVar49[6] - auVar48[6],uVar8));
        auVar30._0_10_ = CONCAT19(auVar49[9] - auVar48[9],CONCAT18(auVar49[8] - auVar48[8],uVar9));
        auVar30[10] = auVar49[10] - auVar48[10];
        auVar30[0xb] = auVar49[0xb] - auVar48[0xb];
        auVar32[0xc] = auVar49[0xc] - auVar48[0xc];
        auVar32._0_12_ = auVar30;
        auVar32[0xd] = auVar49[0xd] - auVar48[0xd];
        auVar37[0xe] = auVar49[0xe] - auVar48[0xe];
        auVar37._0_14_ = auVar32;
        auVar37[0xf] = auVar49[0xf] - auVar48[0xf];
        auVar49 = auVar37 & _DAT_0010f550;
        auVar34._0_2_ = uVar6 >> 2;
        auVar34._2_2_ = (ushort)((uint)uVar7 >> 0x12);
        auVar34._4_2_ = (ushort)((uint6)uVar8 >> 0x22);
        auVar34._6_2_ = (ushort)((ulong)uVar9 >> 0x32);
        auVar34._8_2_ = (ushort)((unkuint10)auVar30._0_10_ >> 0x42);
        auVar34._10_2_ = auVar30._10_2_ >> 2;
        auVar34._12_2_ = auVar32._12_2_ >> 2;
        auVar34._14_2_ = auVar37._14_2_ >> 2;
        auVar34 = auVar34 & _DAT_0010f550;
        cVar25 = auVar34[0] + auVar49[0];
        bVar39 = auVar34[1] + auVar49[1];
        uVar26 = CONCAT11(bVar39,cVar25);
        cVar40 = auVar34[2] + auVar49[2];
        bVar41 = auVar34[3] + auVar49[3];
        uVar27 = CONCAT13(bVar41,CONCAT12(cVar40,uVar26));
        cVar42 = auVar34[4] + auVar49[4];
        bVar43 = auVar34[5] + auVar49[5];
        uVar28 = CONCAT15(bVar43,CONCAT14(cVar42,uVar27));
        cVar44 = auVar34[6] + auVar49[6];
        bVar45 = auVar34[7] + auVar49[7];
        uVar29 = CONCAT17(bVar45,CONCAT16(cVar44,uVar28));
        cVar46 = auVar34[8] + auVar49[8];
        bVar47 = auVar34[9] + auVar49[9];
        auVar31._0_10_ = CONCAT19(bVar47,CONCAT18(cVar46,uVar29));
        auVar31[10] = auVar34[10] + auVar49[10];
        auVar31[0xb] = auVar34[0xb] + auVar49[0xb];
        auVar33[0xc] = auVar34[0xc] + auVar49[0xc];
        auVar33._0_12_ = auVar31;
        auVar33[0xd] = auVar34[0xd] + auVar49[0xd];
        auVar35[0xe] = auVar34[0xe] + auVar49[0xe];
        auVar35._0_14_ = auVar33;
        auVar35[0xf] = auVar34[0xf] + auVar49[0xf];
        auVar36._0_2_ = auVar14._0_2_ >> 1;
        auVar36._2_2_ = auVar14._2_2_ >> 1;
        auVar36._4_2_ = auVar14._4_2_ >> 1;
        auVar36._6_2_ = auVar14._6_2_ >> 1;
        auVar36._8_2_ = auVar14._8_2_ >> 1;
        auVar36._10_2_ = auVar14._10_2_ >> 1;
        auVar36._12_2_ = auVar14._12_2_ >> 1;
        auVar36._14_2_ = auVar14._14_2_ >> 1;
        auVar36 = auVar36 & _DAT_0010f540;
        uVar6 = CONCAT11(auVar14[1] - auVar36[1],auVar14[0] - auVar36[0]);
        uVar7 = CONCAT13(auVar14[3] - auVar36[3],CONCAT12(auVar14[2] - auVar36[2],uVar6));
        uVar8 = CONCAT15(auVar14[5] - auVar36[5],CONCAT14(auVar14[4] - auVar36[4],uVar7));
        uVar9 = CONCAT17(auVar14[7] - auVar36[7],CONCAT16(auVar14[6] - auVar36[6],uVar8));
        auVar10._0_10_ = CONCAT19(auVar14[9] - auVar36[9],CONCAT18(auVar14[8] - auVar36[8],uVar9));
        auVar10[10] = auVar14[10] - auVar36[10];
        auVar10[0xb] = auVar14[0xb] - auVar36[0xb];
        auVar12[0xc] = auVar14[0xc] - auVar36[0xc];
        auVar12._0_12_ = auVar10;
        auVar12[0xd] = auVar14[0xd] - auVar36[0xd];
        auVar49[0xe] = auVar14[0xe] - auVar36[0xe];
        auVar49._0_14_ = auVar12;
        auVar49[0xf] = auVar14[0xf] - auVar36[0xf];
        auVar37 = auVar49 & _DAT_0010f550;
        auVar14._0_2_ = uVar6 >> 2;
        auVar14._2_2_ = (ushort)((uint)uVar7 >> 0x12);
        auVar14._4_2_ = (ushort)((uint6)uVar8 >> 0x22);
        auVar14._6_2_ = (ushort)((ulong)uVar9 >> 0x32);
        auVar14._8_2_ = (ushort)((unkuint10)auVar10._0_10_ >> 0x42);
        auVar14._10_2_ = auVar10._10_2_ >> 2;
        auVar14._12_2_ = auVar12._12_2_ >> 2;
        auVar14._14_2_ = auVar49._14_2_ >> 2;
        auVar14 = auVar14 & _DAT_0010f550;
        cVar5 = auVar14[0] + auVar37[0];
        bVar16 = auVar14[1] + auVar37[1];
        uVar6 = CONCAT11(bVar16,cVar5);
        cVar17 = auVar14[2] + auVar37[2];
        bVar18 = auVar14[3] + auVar37[3];
        uVar7 = CONCAT13(bVar18,CONCAT12(cVar17,uVar6));
        cVar19 = auVar14[4] + auVar37[4];
        bVar20 = auVar14[5] + auVar37[5];
        uVar8 = CONCAT15(bVar20,CONCAT14(cVar19,uVar7));
        cVar21 = auVar14[6] + auVar37[6];
        bVar22 = auVar14[7] + auVar37[7];
        uVar9 = CONCAT17(bVar22,CONCAT16(cVar21,uVar8));
        cVar23 = auVar14[8] + auVar37[8];
        bVar24 = auVar14[9] + auVar37[9];
        auVar11._0_10_ = CONCAT19(bVar24,CONCAT18(cVar23,uVar9));
        auVar11[10] = auVar14[10] + auVar37[10];
        auVar11[0xb] = auVar14[0xb] + auVar37[0xb];
        auVar13[0xc] = auVar14[0xc] + auVar37[0xc];
        auVar13._0_12_ = auVar11;
        auVar13[0xd] = auVar14[0xd] + auVar37[0xd];
        auVar15[0xe] = auVar14[0xe] + auVar37[0xe];
        auVar15._0_14_ = auVar13;
        auVar15[0xf] = auVar14[0xf] + auVar37[0xf];
        auVar38[0] = ((char)(uVar6 >> 4) + cVar5 & 0xfU) + ((char)(uVar26 >> 4) + cVar25 & 0xfU);
        auVar38[1] = ((bVar16 >> 4) + bVar16 & 0xf) + ((bVar39 >> 4) + bVar39 & 0xf);
        auVar38[2] = ((char)(ushort)((uint)uVar7 >> 0x14) + cVar17 & 0xfU) +
                     ((char)(ushort)((uint)uVar27 >> 0x14) + cVar40 & 0xfU);
        auVar38[3] = ((bVar18 >> 4) + bVar18 & 0xf) + ((bVar41 >> 4) + bVar41 & 0xf);
        auVar38[4] = ((char)(ushort)((uint6)uVar8 >> 0x24) + cVar19 & 0xfU) +
                     ((char)(ushort)((uint6)uVar28 >> 0x24) + cVar42 & 0xfU);
        auVar38[5] = ((bVar20 >> 4) + bVar20 & 0xf) + ((bVar43 >> 4) + bVar43 & 0xf);
        auVar38[6] = ((char)(ushort)((ulong)uVar9 >> 0x34) + cVar21 & 0xfU) +
                     ((char)(ushort)((ulong)uVar29 >> 0x34) + cVar44 & 0xfU);
        auVar38[7] = ((bVar22 >> 4) + bVar22 & 0xf) + ((bVar45 >> 4) + bVar45 & 0xf);
        auVar38[8] = ((char)(ushort)((unkuint10)auVar11._0_10_ >> 0x44) + cVar23 & 0xfU) +
                     ((char)(ushort)((unkuint10)auVar31._0_10_ >> 0x44) + cVar46 & 0xfU);
        auVar38[9] = ((bVar24 >> 4) + bVar24 & 0xf) + ((bVar47 >> 4) + bVar47 & 0xf);
        auVar38[10] = ((char)(auVar11._10_2_ >> 4) + auVar11[10] & 0xfU) +
                      ((char)(auVar31._10_2_ >> 4) + auVar31[10] & 0xfU);
        auVar38[0xb] = ((auVar11[0xb] >> 4) + auVar11[0xb] & 0xf) +
                       ((auVar31[0xb] >> 4) + auVar31[0xb] & 0xf);
        auVar38[0xc] = ((char)(auVar13._12_2_ >> 4) + auVar13[0xc] & 0xfU) +
                       ((char)(auVar33._12_2_ >> 4) + auVar33[0xc] & 0xfU);
        auVar38[0xd] = ((auVar13[0xd] >> 4) + auVar13[0xd] & 0xf) +
                       ((auVar33[0xd] >> 4) + auVar33[0xd] & 0xf);
        auVar38[0xe] = ((char)(auVar15._14_2_ >> 4) + auVar15[0xe] & 0xfU) +
                       ((char)(auVar35._14_2_ >> 4) + auVar35[0xe] & 0xfU);
        auVar38[0xf] = ((auVar15[0xf] >> 4) + auVar15[0xf] & 0xf) +
                       ((auVar35[0xf] >> 4) + auVar35[0xf] & 0xf);
        auVar14 = psadbw(auVar38,(undefined1  [16])0x0);
        iVar2 = iVar2 + auVar14._8_4_ + auVar14._0_4_;
      }
    }
    else {
      uVar3 = avx2_harley_seal_popcount256(data,in_RSI);
      iVar2 = (int)uVar3;
    }
  }
  else {
    uVar3 = avx512_vpopcount((__m512i *)bitset->words,in_RSI);
    iVar2 = (int)uVar3;
  }
  return iVar2;
}

Assistant:

int bitset_container_compute_cardinality(const bitset_container_t *bitset) {
    int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (support & ROARING_SUPPORTS_AVX512) {
        return (int)avx512_vpopcount(
            (const __m512i *)bitset->words,
            BITSET_CONTAINER_SIZE_IN_WORDS / (WORDS_IN_AVX512_REG));
    } else
#endif  // CROARING_COMPILER_SUPPORTS_AVX512
        if (support & ROARING_SUPPORTS_AVX2) {
            return (int)avx2_harley_seal_popcount256(
                (const __m256i *)bitset->words,
                BITSET_CONTAINER_SIZE_IN_WORDS / (CROARING_WORDS_IN_AVX2_REG));
        } else {
            return _scalar_bitset_container_compute_cardinality(bitset);
        }
}